

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxout.cpp
# Opt level: O0

void __thiscall
ConfidentialTxOutReference_GetSerializeVsize_Test::TestBody
          (ConfidentialTxOutReference_GetSerializeVsize_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Amount AVar3;
  AssertHelper local_350;
  Message local_348;
  uint32_t local_340 [2];
  undefined1 local_338 [8];
  AssertionResult gtest_ar_3;
  Message local_320;
  uint32_t local_318 [2];
  undefined1 local_310 [8];
  AssertionResult gtest_ar_2;
  Message local_2f8;
  uint32_t local_2f0 [2];
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_1;
  Message local_2d0;
  int local_2c8;
  uint32_t local_2c4;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar;
  ConfidentialTxOutReference txout_ref;
  Amount local_1a8;
  ConfidentialValue local_198;
  undefined1 local_170 [8];
  ConfidentialTxOut txout;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  ConfidentialAssetId asset;
  int64_t satoshi;
  ConfidentialTxOutReference_GetSerializeVsize_Test *this_local;
  
  asset.version_ = '@';
  asset._33_7_ = 0xf42;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_60,"1234567890123456789012345678901234567890123456789012345678901234",
             &local_61);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(asset._32_8_);
  local_1a8.amount_ = AVar3.amount_;
  local_1a8.ignore_check_ = AVar3.ignore_check_;
  cfd::core::ConfidentialValue::ConfidentialValue(&local_198,&local_1a8);
  cfd::core::ConfidentialTxOut::ConfidentialTxOut
            ((ConfidentialTxOut *)local_170,&exp_script,(ConfidentialAssetId *)local_40,&local_198);
  cfd::core::ConfidentialValue::~ConfidentialValue(&local_198);
  cfd::core::ConfidentialTxOutReference::ConfidentialTxOutReference
            ((ConfidentialTxOutReference *)&gtest_ar.message_,(ConfidentialTxOut *)local_170);
  local_2c4 = cfd::core::ConfidentialTxOutReference::GetSerializeVsize
                        ((ConfidentialTxOutReference *)&gtest_ar.message_,false,0,0x34,
                         (uint32_t *)0x0,0);
  local_2c8 = 0x43;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_2c0,"txout_ref.GetSerializeVsize(false)","67",&local_2c4,
             &local_2c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
  if (!bVar1) {
    testing::Message::Message(&local_2d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x15e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_2d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
  local_2f0[1] = 0x376;
  local_2f0[0] = cfd::core::ConfidentialTxOutReference::GetSerializeVsize
                           ((ConfidentialTxOutReference *)&gtest_ar.message_,true,0,0x24,
                            (uint32_t *)0x0,0);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_2e8,"886","txout_ref.GetSerializeVsize(true, 0, 36)",
             (int *)(local_2f0 + 1),local_2f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar1) {
    testing::Message::Message(&local_2f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x160,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  local_318[1] = 0x4b6;
  local_318[0] = cfd::core::ConfidentialTxOutReference::GetSerializeVsize
                           ((ConfidentialTxOutReference *)&gtest_ar.message_,true,0,0x34,
                            (uint32_t *)0x0,0);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_310,"1206","txout_ref.GetSerializeVsize(true, 0, 52)",
             (int *)(local_318 + 1),local_318);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
  if (!bVar1) {
    testing::Message::Message(&local_320);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x162,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_320);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_320);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
  local_340[1] = 0x4a7;
  local_340[0] = cfd::core::ConfidentialTxOutReference::GetSerializeVsize
                           ((ConfidentialTxOutReference *)&gtest_ar.message_,true,0,0x34,
                            (uint32_t *)0x0,2);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_338,"1191",
             "txout_ref.GetSerializeVsize(true, 0, 52, nullptr, 2)",(int *)(local_340 + 1),local_340
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
  if (!bVar1) {
    testing::Message::Message(&local_348);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_338);
    testing::internal::AssertHelper::AssertHelper
              (&local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x164,pcVar2);
    testing::internal::AssertHelper::operator=(&local_350,&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_350);
    testing::Message::~Message(&local_348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference
            ((ConfidentialTxOutReference *)&gtest_ar.message_);
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut((ConfidentialTxOut *)local_170);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)local_40);
  return;
}

Assistant:

TEST(ConfidentialTxOutReference, GetSerializeVsize) {
  int64_t satoshi = 1000000;
  ConfidentialAssetId asset("1234567890123456789012345678901234567890123456789012345678901234");
  ConfidentialTxOut txout(exp_script, asset,
      ConfidentialValue(Amount::CreateBySatoshiAmount(satoshi)));
  ConfidentialTxOutReference txout_ref(txout);

  EXPECT_EQ(txout_ref.GetSerializeVsize(false), 67);

  EXPECT_EQ(886, txout_ref.GetSerializeVsize(true, 0, 36));

  EXPECT_EQ(1206, txout_ref.GetSerializeVsize(true, 0, 52));

  EXPECT_EQ(1191, txout_ref.GetSerializeVsize(true, 0, 52, nullptr, 2));
}